

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O3

HeaderField * __thiscall HPack::FieldLookupTable::back(FieldLookupTable *this)

{
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *pvVar1;
  long lVar2;
  const_reference pvVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = this->end - 1;
  pvVar3 = std::
           deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
           ::operator[](&this->chunks,(ulong)(uVar5 >> 4));
  pvVar1 = (pvVar3->_M_t).
           super___uniq_ptr_impl<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
           .
           super__Head_base<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_false>
           ._M_head_impl;
  if (pvVar1 == (vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)0x0) {
    back();
  }
  else {
    uVar5 = uVar5 & 0xf;
    lVar2 = *(long *)&(pvVar1->
                      super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
                      _M_impl;
    uVar4 = ((long)*(pointer *)
                    ((long)&(pvVar1->
                            super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>
                            )._M_impl + 8) - lVar2 >> 4) * -0x5555555555555555;
    if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
      return (HeaderField *)(lVar2 + (ulong)(uVar5 * 0x30));
    }
  }
  back();
}

Assistant:

const HeaderField &FieldLookupTable::back() const
{
    Q_ASSERT(nDynamic && end && end != begin);

    const quint32 absIndex = end - 1;
    const quint32 chunkIndex = absIndex / ChunkSize;
    Q_ASSERT(chunkIndex < chunks.size());
    const quint32 offset = absIndex % ChunkSize;
    return (*chunks[chunkIndex])[offset];
}